

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int FE_Insert_Character(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  
  field = form->current;
  _Var1 = Check_Char(field->type,0x20,(TypeArgument *)field->arg);
  iVar2 = -0xc;
  if (_Var1) {
    _Var1 = Is_There_Room_For_A_Char_In_Line(form);
    if (_Var1) {
LAB_003a0d8b:
      winsch(form->w,0x20);
      iVar2 = Wrapping_Not_Necessary_Or_Wrapping_Ok(form);
      return iVar2;
    }
    if (((int)field->rows + field->nrow == 1) && ((field->status & 8) != 0)) {
      _Var1 = Field_Grown(field,1);
      iVar2 = -1;
      if (_Var1) goto LAB_003a0d8b;
    }
  }
  return iVar2;
}

Assistant:

static int FE_Insert_Character(FORM * form)
{
  FIELD *field = form->current;
  int result = E_REQUEST_DENIED;

  if (Check_Char(field->type,(int)C_BLANK,(TypeArgument *)(field->arg)))
    {
      bool There_Is_Room = Is_There_Room_For_A_Char_In_Line(form);

      if (There_Is_Room ||
          ((Single_Line_Field(field) && Growable(field))))
        {
          if (!There_Is_Room && !Field_Grown(field,1))
            result =  E_SYSTEM_ERROR;
          else
            {
              winsch(form->w,(chtype)C_BLANK);
              result = Wrapping_Not_Necessary_Or_Wrapping_Ok(form);
            }
        }
    }
  return result;
}